

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void sellobj_state(int deliberate)

{
  sell_response = 'a';
  if (deliberate != 0) {
    sell_response = '\0';
  }
  sell_how = deliberate;
  auto_credit = 0;
  return;
}

Assistant:

void sellobj_state(int deliberate)
{
	/* If we're deliberately dropping something, there's no automatic
	   response to the shopkeeper's "want to sell" query; however, if we
	   accidentally drop anything, the shk will buy it/them without asking.
	   This retains the old pre-query risk that slippery fingers while in
	   shops entailed:  you drop it, you've lost it.
	 */
	sell_response = (deliberate != SELL_NORMAL) ? '\0' : 'a';
	sell_how = deliberate;
	auto_credit = FALSE;
}